

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O2

void __thiscall
Am_Initializer::Am_Initializer
          (Am_Initializer *this,char *this_name,Am_Initializer_Procedure *init_proc,
          float this_priority,uint aCheckPoint,Am_Initializer_Procedure *cleanup_proc)

{
  const_iterator __position;
  Am_Initializer *local_18;
  
  this->name = this_name;
  this->priority = this_priority;
  this->mCheckPoint = aCheckPoint;
  this->init = init_proc;
  this->cleanup = cleanup_proc;
  __position._M_node = (_List_node_base *)am_initializer_list_abi_cxx11_;
  local_18 = this;
  if (am_initializer_list_abi_cxx11_ == (INITIALIZERLIST *)0x0) {
    am_initializer_list_abi_cxx11_ = (INITIALIZERLIST *)operator_new(0x18);
    ((_List_node_base *)am_initializer_list_abi_cxx11_)->_M_prev =
         (_List_node_base *)am_initializer_list_abi_cxx11_;
    ((_List_node_base *)am_initializer_list_abi_cxx11_)->_M_next =
         (_List_node_base *)am_initializer_list_abi_cxx11_;
    ((_List_node_base *)((long)am_initializer_list_abi_cxx11_ + 0x10))->_M_next =
         (_List_node_base *)0x0;
    std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::push_front
              (am_initializer_list_abi_cxx11_,&local_18);
  }
  else {
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)am_initializer_list_abi_cxx11_) {
        std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::push_back
                  (am_initializer_list_abi_cxx11_,&local_18);
        return;
      }
    } while (*(float *)&(__position._M_node[1]._M_next)->_M_prev < this_priority);
    std::__cxx11::list<Am_Initializer*,std::allocator<Am_Initializer*>>::emplace<Am_Initializer*>
              ((list<Am_Initializer*,std::allocator<Am_Initializer*>> *)
               am_initializer_list_abi_cxx11_,__position,&local_18);
  }
  return;
}

Assistant:

Am_Initializer::Am_Initializer(const char *this_name,
                               Am_Initializer_Procedure *init_proc,
                               float this_priority, unsigned aCheckPoint,
                               Am_Initializer_Procedure *cleanup_proc)
    : cleanup(cleanup_proc), init(init_proc), name(this_name),
      priority(this_priority), mCheckPoint(aCheckPoint)
{
  // if this list is empty, we just add the element
  if (am_initializer_list == static_cast<INITIALIZERLIST *>(nullptr)) {
    am_initializer_list = new INITIALIZERLIST();
    am_initializer_list->push_front(this);
  } else {
    bool inserted(false);

    for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
         it != am_initializer_list->end(); ++it) {
      // check to see if we have reached the point
      // where the object is inserted before
      if ((*it)->priority >= this_priority) {
        // insert the object and flag this
        am_initializer_list->insert(it, this);
        inserted = true;

        // exit the loop
        break;
      }
    }

    if (inserted == false) {
      // add to the end of the list
      am_initializer_list->push_back(this);
    }
  }
}